

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

ScriptElement * __thiscall
cfd::core::ScriptElement::operator=(ScriptElement *this,ScriptElement *element)

{
  if (this != element) {
    this->type_ = element->type_;
    (this->op_code_).data_type_ = (element->op_code_).data_type_;
    ::std::__cxx11::string::_M_assign((string *)&(this->op_code_).text_data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->binary_data_,
               &(element->binary_data_).data_);
    this->value_ = element->value_;
  }
  return this;
}

Assistant:

ScriptElement& ScriptElement::operator=(const ScriptElement& element) {
  if (this != &element) {
    type_ = element.type_;
    op_code_ = element.op_code_;
    binary_data_ = element.binary_data_;
    value_ = element.value_;
  }
  return *this;
}